

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

string * SettingName(string *__return_storage_ptr__,string *arg)

{
  long lVar1;
  size_type sVar2;
  pointer pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = arg->_M_string_length;
  if ((sVar2 == 0) || (*(arg->_M_dataplus)._M_p != '-')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (arg->_M_dataplus)._M_p;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00d5dcfe;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00d5dcfe:
      __stack_chk_fail();
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,arg,1,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string SettingName(const std::string& arg)
{
    return arg.size() > 0 && arg[0] == '-' ? arg.substr(1) : arg;
}